

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_AutoChain_Test::TestBody(SSLVersionTest_AutoChain_Test *this)

{
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  bool bVar1;
  char *pcVar2;
  pointer psVar3;
  X509_STORE *pXVar4;
  X509 *pXVar5;
  pointer psVar6;
  stack_st_X509 *psVar7;
  pointer pxVar8;
  _func_int_SSL_ptr_void_ptr *p_Var9;
  UniquePtr<X509> *pUVar10;
  char *in_R9;
  string local_978;
  AssertHelper local_958;
  Message local_950;
  allocator<x509_st_*> local_941;
  pointer local_940;
  pointer local_938;
  iterator local_930;
  size_type local_928;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_920;
  bool local_901;
  undefined1 local_900 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_8d0;
  Message local_8c8;
  allocator<x509_st_*> local_8b9;
  pointer local_8b8;
  pointer local_8b0;
  iterator local_8a8;
  size_type local_8a0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_898;
  bool local_879;
  undefined1 local_878 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_848;
  Message local_840;
  ClientConfig local_838;
  bool local_7d1;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar__18;
  undefined1 local_7b8 [7];
  anon_class_1_0_00000001 install_intermediate;
  AssertHelper local_798;
  Message local_790;
  allocator<x509_st_*> local_781;
  pointer local_780;
  pointer local_778;
  iterator local_770;
  size_type local_768;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_760;
  bool local_741;
  undefined1 local_740 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_710;
  Message local_708;
  allocator<x509_st_*> local_6f9;
  pointer local_6f8;
  pointer local_6f0;
  iterator local_6e8;
  size_type local_6e0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_6d8;
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_688;
  Message local_680;
  ClientConfig local_678;
  bool local_619;
  undefined1 local_618 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_5e8;
  Message local_5e0;
  int local_5d4;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_5a0;
  Message local_598;
  int local_58c;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_558;
  Message local_550;
  allocator<x509_st_*> local_541;
  pointer local_540;
  pointer local_538;
  iterator local_530;
  size_type local_528;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_520;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_4d0;
  Message local_4c8;
  allocator<x509_st_*> local_4b9;
  pointer local_4b8;
  pointer local_4b0;
  iterator local_4a8;
  size_type local_4a0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_498;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_448;
  Message local_440;
  ClientConfig local_438;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_3a8;
  Message local_3a0;
  allocator<x509_st_*> local_391;
  pointer local_390;
  iterator local_388;
  size_type local_380;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_378;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_328;
  Message local_320;
  allocator<x509_st_*> local_311;
  pointer local_310;
  iterator local_308;
  size_type local_300;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_2f8;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2a8;
  Message local_2a0;
  ClientConfig local_298;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_200;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509> intermediate;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  string local_68;
  AssertHelper local_48 [3];
  Message local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  SSLVersionTest_AutoChain_Test *this_local;
  
  GetChainTestCertificate();
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator=
            (&(this->super_SSLVersionTest).cert_,
             (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,&(this->super_SSLVersionTest).cert_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)"cert_","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x110e,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    GetChainTestKey();
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=
              (&(this->super_SSLVersionTest).key_,
               (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,&(this->super_SSLVersionTest).key_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&intermediate,(internal *)local_88,(AssertionResult *)0x4f04da,"false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1110,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&intermediate);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      GetChainTestIntermediate();
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,
                   (AssertionResult *)"intermediate","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1112,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).client_ctx_);
        local_111 = SSLVersionTest::UseCertAndKey(&this->super_SSLVersionTest,psVar3);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_110,&local_111,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_110,
                     (AssertionResult *)"UseCertAndKey(client_ctx_.get())","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1114,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        if (bVar1) {
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             (&(this->super_SSLVersionTest).server_ctx_);
          local_159 = SSLVersionTest::UseCertAndKey(&this->super_SSLVersionTest,psVar3);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_158,&local_159,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_158,
                       (AssertionResult *)"UseCertAndKey(server_ctx_.get())","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1115,pcVar2);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
          if (bVar1) {
            psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               (&(this->super_SSLVersionTest).client_ctx_);
            pXVar4 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3);
            pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__2.message_);
            local_1a4 = X509_STORE_add_cert(pXVar4,pXVar5);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a0,&local_1a4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1a0,
                         (AssertionResult *)
                         "X509_STORE_add_cert(SSL_CTX_get_cert_store(client_ctx_.get()), intermediate.get())"
                         ,"false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x111a,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            if (bVar1) {
              psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                 (&(this->super_SSLVersionTest).server_ctx_);
              pXVar4 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3);
              pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__2.message_);
              local_1ec = X509_STORE_add_cert(pXVar4,pXVar5);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1e8,&local_1ec,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
              if (!bVar1) {
                testing::Message::Message(&local_1f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1e8,
                           (AssertionResult *)
                           "X509_STORE_add_cert(SSL_CTX_get_cert_store(server_ctx_.get()), intermediate.get())"
                           ,"false","true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_200,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x111c,pcVar2);
                testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper(&local_200);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_1f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
              if (bVar1) {
                psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_ctx_);
                SSL_CTX_set_verify((SSL_CTX *)psVar3,3,(callback *)0x0);
                psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_ctx_);
                SSL_CTX_set_verify((SSL_CTX *)psVar3,3,(callback *)0x0);
                psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).client_ctx_);
                SSL_CTX_set_cert_verify_callback((SSL_CTX *)psVar3,VerifySucceed,(void *)0x0);
                psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                   (&(this->super_SSLVersionTest).server_ctx_);
                SSL_CTX_set_cert_verify_callback((SSL_CTX *)psVar3,VerifySucceed,(void *)0x0);
                local_298.verify_hostname.field_2._M_allocated_capacity = 0;
                local_298.verify_hostname.field_2._8_8_ = 0;
                local_298.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
                local_298.verify_hostname._1_7_ = 0;
                local_298.verify_hostname._M_string_length = 0;
                local_298.servername.field_2._M_allocated_capacity = 0;
                local_298.servername.field_2._8_8_ = 0;
                local_298.servername._M_dataplus = (_Alloc_hider)0x0;
                local_298.servername._1_7_ = 0;
                local_298.servername._M_string_length = 0;
                local_298.session = (SSL_SESSION *)0x0;
                local_298.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
                local_298.hostflags = 0;
                local_298.early_data = false;
                local_298._85_3_ = 0;
                ClientConfig::ClientConfig(&local_298);
                local_231 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_298);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_230,&local_231,(type *)0x0);
                ClientConfig::~ClientConfig(&local_298);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_230);
                if (!bVar1) {
                  testing::Message::Message(&local_2a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_230,
                             (AssertionResult *)"Connect()","false","true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2a8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1127,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
                  testing::internal::AssertHelper::~AssertHelper(&local_2a8);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_2a0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
                if (bVar1) {
                  psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).client_);
                  psVar7 = SSL_get_peer_full_cert_chain(psVar6);
                  local_310 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        (&(this->super_SSLVersionTest).cert_);
                  local_308 = &local_310;
                  local_300 = 1;
                  std::allocator<x509_st_*>::allocator(&local_311);
                  __l_06._M_len = local_300;
                  __l_06._M_array = local_308;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_2f8,__l_06,&local_311);
                  local_2d9 = ChainsEqual(psVar7,&local_2f8);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_2f8);
                  std::allocator<x509_st_*>::~allocator(&local_311);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2d8);
                  if (!bVar1) {
                    testing::Message::Message(&local_320);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__9.message_,(internal *)local_2d8,
                               (AssertionResult *)
                               "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get()})"
                               ,"false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_328,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x112a,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_328,&local_320);
                    testing::internal::AssertHelper::~AssertHelper(&local_328);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(&local_320);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
                  psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).server_);
                  psVar7 = SSL_get_peer_full_cert_chain(psVar6);
                  local_390 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        (&(this->super_SSLVersionTest).cert_);
                  local_388 = &local_390;
                  local_380 = 1;
                  std::allocator<x509_st_*>::allocator(&local_391);
                  __l_05._M_len = local_380;
                  __l_05._M_array = local_388;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_378,__l_05,&local_391);
                  local_359 = ChainsEqual(psVar7,&local_378);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_358,&local_359,(type *)0x0);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_378);
                  std::allocator<x509_st_*>::~allocator(&local_391);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_358);
                  if (!bVar1) {
                    testing::Message::Message(&local_3a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__10.message_,(internal *)local_358,
                               (AssertionResult *)
                               "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get()})"
                               ,"false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_3a8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x112c,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
                    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
                    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                    testing::Message::~Message(&local_3a0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
                  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).client_ctx_);
                  SSL_CTX_clear_mode(psVar3,8);
                  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).server_ctx_);
                  SSL_CTX_clear_mode(psVar3,8);
                  local_438.verify_hostname.field_2._M_allocated_capacity = 0;
                  local_438.verify_hostname.field_2._8_8_ = 0;
                  local_438.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
                  local_438.verify_hostname._1_7_ = 0;
                  local_438.verify_hostname._M_string_length = 0;
                  local_438.servername.field_2._M_allocated_capacity = 0;
                  local_438.servername.field_2._8_8_ = 0;
                  local_438.servername._M_dataplus = (_Alloc_hider)0x0;
                  local_438.servername._1_7_ = 0;
                  local_438.servername._M_string_length = 0;
                  local_438.session = (SSL_SESSION *)0x0;
                  local_438.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
                  local_438.hostflags = 0;
                  local_438.early_data = false;
                  local_438._85_3_ = 0;
                  ClientConfig::ClientConfig(&local_438);
                  local_3d9 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_438);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
                  ClientConfig::~ClientConfig(&local_438);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3d8);
                  if (!bVar1) {
                    testing::Message::Message(&local_440);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__11.message_,(internal *)local_3d8,
                               (AssertionResult *)"Connect()","false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_448,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1131,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_448,&local_440);
                    testing::internal::AssertHelper::~AssertHelper(&local_448);
                    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                    testing::Message::~Message(&local_440);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
                  if (bVar1) {
                    psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                       (&(this->super_SSLVersionTest).client_);
                    psVar7 = SSL_get_peer_full_cert_chain(psVar6);
                    local_4b8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).cert_);
                    local_4b0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__2.message_);
                    local_4a8 = &local_4b8;
                    local_4a0 = 2;
                    std::allocator<x509_st_*>::allocator(&local_4b9);
                    __l_04._M_len = local_4a0;
                    __l_04._M_array = local_4a8;
                    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                              (&local_498,__l_04,&local_4b9);
                    local_479 = ChainsEqual(psVar7,&local_498);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_478,&local_479,(type *)0x0);
                    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_498);
                    std::allocator<x509_st_*>::~allocator(&local_4b9);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_478);
                    if (!bVar1) {
                      testing::Message::Message(&local_4c8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__12.message_,(internal *)local_478,
                                 (AssertionResult *)
                                 "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get(), intermediate.get()})"
                                 ,"false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_4d0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x1134,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
                      testing::internal::AssertHelper::~AssertHelper(&local_4d0);
                      std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                      testing::Message::~Message(&local_4c8);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
                    psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                       (&(this->super_SSLVersionTest).server_);
                    psVar7 = SSL_get_peer_full_cert_chain(psVar6);
                    local_540 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          (&(this->super_SSLVersionTest).cert_);
                    local_538 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__2.message_);
                    local_530 = &local_540;
                    local_528 = 2;
                    std::allocator<x509_st_*>::allocator(&local_541);
                    __l_03._M_len = local_528;
                    __l_03._M_array = local_530;
                    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                              (&local_520,__l_03,&local_541);
                    local_501 = ChainsEqual(psVar7,&local_520);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_500,&local_501,(type *)0x0);
                    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_520);
                    std::allocator<x509_st_*>::~allocator(&local_541);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_500);
                    if (!bVar1) {
                      testing::Message::Message(&local_550);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__13.message_,(internal *)local_500,
                                 (AssertionResult *)
                                 "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get(), intermediate.get()})"
                                 ,"false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_558,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x1136,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_558,&local_550);
                      testing::internal::AssertHelper::~AssertHelper(&local_558);
                      std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                      testing::Message::~Message(&local_550);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
                    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                       (&(this->super_SSLVersionTest).client_ctx_);
                    pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                       (&(this->super_SSLVersionTest).cert_);
                    local_58c = SSL_CTX_add1_chain_cert(psVar3,pxVar8);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_588,&local_58c,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_588);
                    if (!bVar1) {
                      testing::Message::Message(&local_598);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__14.message_,(internal *)local_588,
                                 (AssertionResult *)
                                 "SSL_CTX_add1_chain_cert(client_ctx_.get(), cert_.get())","false",
                                 "true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_5a0,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x1139,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
                      testing::internal::AssertHelper::~AssertHelper(&local_5a0);
                      std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                      testing::Message::~Message(&local_598);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
                    if (bVar1) {
                      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         (&(this->super_SSLVersionTest).server_ctx_);
                      pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                         (&(this->super_SSLVersionTest).cert_);
                      local_5d4 = SSL_CTX_add1_chain_cert(psVar3,pxVar8);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_5d0,&local_5d4,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_5d0);
                      if (!bVar1) {
                        testing::Message::Message(&local_5e0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__15.message_,(internal *)local_5d0,
                                   (AssertionResult *)
                                   "SSL_CTX_add1_chain_cert(server_ctx_.get(), cert_.get())","false"
                                   ,"true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_5e8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x113a,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
                        testing::internal::AssertHelper::~AssertHelper(&local_5e8);
                        std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                        testing::Message::~Message(&local_5e0);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
                      if (bVar1) {
                        local_678.verify_hostname.field_2._M_allocated_capacity = 0;
                        local_678.verify_hostname.field_2._8_8_ = 0;
                        local_678.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
                        local_678.verify_hostname._1_7_ = 0;
                        local_678.verify_hostname._M_string_length = 0;
                        local_678.servername.field_2._M_allocated_capacity = 0;
                        local_678.servername.field_2._8_8_ = 0;
                        local_678.servername._M_dataplus = (_Alloc_hider)0x0;
                        local_678.servername._1_7_ = 0;
                        local_678.servername._M_string_length = 0;
                        local_678.session = (SSL_SESSION *)0x0;
                        local_678.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
                        local_678.hostflags = 0;
                        local_678.early_data = false;
                        local_678._85_3_ = 0;
                        ClientConfig::ClientConfig(&local_678);
                        local_619 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_678);
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_618,&local_619,(type *)0x0);
                        ClientConfig::~ClientConfig(&local_678);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_618);
                        if (!bVar1) {
                          testing::Message::Message(&local_680);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__16.message_,(internal *)local_618,
                                     (AssertionResult *)"Connect()","false","true",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_688,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x113b,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_688,&local_680);
                          testing::internal::AssertHelper::~AssertHelper(&local_688);
                          std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                          testing::Message::~Message(&local_680);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
                        if (bVar1) {
                          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                             (&(this->super_SSLVersionTest).client_);
                          psVar7 = SSL_get_peer_full_cert_chain(psVar6);
                          pUVar10 = &(this->super_SSLVersionTest).cert_;
                          local_6f8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                (pUVar10);
                          local_6f0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                (pUVar10);
                          local_6e8 = &local_6f8;
                          local_6e0 = 2;
                          std::allocator<x509_st_*>::allocator(&local_6f9);
                          __l_02._M_len = local_6e0;
                          __l_02._M_array = local_6e8;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_6d8,__l_02,&local_6f9);
                          local_6b9 = ChainsEqual(psVar7,&local_6d8);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_6b8,&local_6b9,(type *)0x0);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_6d8);
                          std::allocator<x509_st_*>::~allocator(&local_6f9);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_6b8);
                          if (!bVar1) {
                            testing::Message::Message(&local_708);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__17.message_,(internal *)local_6b8,
                                       (AssertionResult *)
                                       "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get(), cert_.get()})"
                                       ,"false","true",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_710,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x113e,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_710,&local_708);
                            testing::internal::AssertHelper::~AssertHelper(&local_710);
                            std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                            testing::Message::~Message(&local_708);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
                          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                             (&(this->super_SSLVersionTest).server_);
                          psVar7 = SSL_get_peer_full_cert_chain(psVar6);
                          pUVar10 = &(this->super_SSLVersionTest).cert_;
                          local_780 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                (pUVar10);
                          local_778 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                (pUVar10);
                          local_770 = &local_780;
                          local_768 = 2;
                          std::allocator<x509_st_*>::allocator(&local_781);
                          __l_01._M_len = local_768;
                          __l_01._M_array = local_770;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_760,__l_01,&local_781);
                          local_741 = ChainsEqual(psVar7,&local_760);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_740,&local_741,(type *)0x0);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_760);
                          std::allocator<x509_st_*>::~allocator(&local_781);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_740);
                          if (!bVar1) {
                            testing::Message::Message(&local_790);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_7b8,(internal *)local_740,
                                       (AssertionResult *)
                                       "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get(), cert_.get()})"
                                       ,"false","true",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_798,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1140,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_798,&local_790);
                            testing::internal::AssertHelper::~AssertHelper(&local_798);
                            std::__cxx11::string::~string((string *)local_7b8);
                            testing::Message::~Message(&local_790);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
                          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                             (&(this->super_SSLVersionTest).client_ctx_);
                          SSL_CTX_clear_chain_certs(psVar3);
                          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                             (&(this->super_SSLVersionTest).server_ctx_);
                          SSL_CTX_clear_chain_certs(psVar3);
                          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                             (&(this->super_SSLVersionTest).client_ctx_);
                          p_Var9 = (anonymous_namespace)::SSLVersionTest_AutoChain_Test::TestBody()
                                   ::$_0::operator_cast_to_function_pointer
                                             ((__0 *)((long)&gtest_ar__18.message_._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                          pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                             (&(this->super_SSLVersionTest).cert_);
                          SSL_CTX_set_cert_cb(psVar3,p_Var9,pxVar8);
                          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                             (&(this->super_SSLVersionTest).server_ctx_);
                          p_Var9 = (anonymous_namespace)::SSLVersionTest_AutoChain_Test::TestBody()
                                   ::$_0::operator_cast_to_function_pointer
                                             ((__0 *)((long)&gtest_ar__18.message_._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                          pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                             (&(this->super_SSLVersionTest).cert_);
                          SSL_CTX_set_cert_cb(psVar3,p_Var9,pxVar8);
                          local_838.verify_hostname.field_2._M_allocated_capacity = 0;
                          local_838.verify_hostname.field_2._8_8_ = 0;
                          local_838.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
                          local_838.verify_hostname._1_7_ = 0;
                          local_838.verify_hostname._M_string_length = 0;
                          local_838.servername.field_2._M_allocated_capacity = 0;
                          local_838.servername.field_2._8_8_ = 0;
                          local_838.servername._M_dataplus = (_Alloc_hider)0x0;
                          local_838.servername._1_7_ = 0;
                          local_838.servername._M_string_length = 0;
                          local_838.session = (SSL_SESSION *)0x0;
                          local_838.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
                          local_838.hostflags = 0;
                          local_838.early_data = false;
                          local_838._85_3_ = 0;
                          ClientConfig::ClientConfig(&local_838);
                          local_7d1 = SSLVersionTest::Connect
                                                (&this->super_SSLVersionTest,&local_838);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_7d0,&local_7d1,(type *)0x0);
                          ClientConfig::~ClientConfig(&local_838);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_7d0);
                          if (!bVar1) {
                            testing::Message::Message(&local_840);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__19.message_,(internal *)local_7d0,
                                       (AssertionResult *)"Connect()","false","true",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_848,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x114c,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_848,&local_840);
                            testing::internal::AssertHelper::~AssertHelper(&local_848);
                            std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
                            testing::Message::~Message(&local_840);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
                          if (bVar1) {
                            psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_SSLVersionTest).client_);
                            psVar7 = SSL_get_peer_full_cert_chain(psVar6);
                            pUVar10 = &(this->super_SSLVersionTest).cert_;
                            local_8b8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                  (pUVar10);
                            local_8b0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                  (pUVar10);
                            local_8a8 = &local_8b8;
                            local_8a0 = 2;
                            std::allocator<x509_st_*>::allocator(&local_8b9);
                            __l_00._M_len = local_8a0;
                            __l_00._M_array = local_8a8;
                            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                      (&local_898,__l_00,&local_8b9);
                            local_879 = ChainsEqual(psVar7,&local_898);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_878,&local_879,(type *)0x0);
                            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_898);
                            std::allocator<x509_st_*>::~allocator(&local_8b9);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_878);
                            if (!bVar1) {
                              testing::Message::Message(&local_8c8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__20.message_,(internal *)local_878,
                                         (AssertionResult *)
                                         "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get(), cert_.get()})"
                                         ,"false","true",in_R9);
                              pcVar2 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_8d0,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x114f,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_8d0,&local_8c8);
                              testing::internal::AssertHelper::~AssertHelper(&local_8d0);
                              std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
                              testing::Message::~Message(&local_8c8);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_878)
                            ;
                            psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_SSLVersionTest).server_);
                            psVar7 = SSL_get_peer_full_cert_chain(psVar6);
                            pUVar10 = &(this->super_SSLVersionTest).cert_;
                            local_940 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                  (pUVar10);
                            local_938 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                  (pUVar10);
                            local_930 = &local_940;
                            local_928 = 2;
                            std::allocator<x509_st_*>::allocator(&local_941);
                            __l._M_len = local_928;
                            __l._M_array = local_930;
                            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                      (&local_920,__l,&local_941);
                            local_901 = ChainsEqual(psVar7,&local_920);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_900,&local_901,(type *)0x0);
                            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_920);
                            std::allocator<x509_st_*>::~allocator(&local_941);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_900);
                            if (!bVar1) {
                              testing::Message::Message(&local_950);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        (&local_978,(internal *)local_900,
                                         (AssertionResult *)
                                         "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get(), cert_.get()})"
                                         ,"false","true",in_R9);
                              pcVar2 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_958,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1151,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_958,&local_950);
                              testing::internal::AssertHelper::~AssertHelper(&local_958);
                              std::__cxx11::string::~string((string *)&local_978);
                              testing::Message::~Message(&local_950);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_900)
                            ;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, AutoChain) {
  cert_ = GetChainTestCertificate();
  ASSERT_TRUE(cert_);
  key_ = GetChainTestKey();
  ASSERT_TRUE(key_);
  bssl::UniquePtr<X509> intermediate = GetChainTestIntermediate();
  ASSERT_TRUE(intermediate);

  ASSERT_TRUE(UseCertAndKey(client_ctx_.get()));
  ASSERT_TRUE(UseCertAndKey(server_ctx_.get()));

  // Configure both client and server to accept any certificate. Add
  // |intermediate| to the cert store.
  ASSERT_TRUE(X509_STORE_add_cert(SSL_CTX_get_cert_store(client_ctx_.get()),
                                  intermediate.get()));
  ASSERT_TRUE(X509_STORE_add_cert(SSL_CTX_get_cert_store(server_ctx_.get()),
                                  intermediate.get()));
  SSL_CTX_set_verify(client_ctx_.get(),
                     SSL_VERIFY_PEER | SSL_VERIFY_FAIL_IF_NO_PEER_CERT,
                     nullptr);
  SSL_CTX_set_verify(server_ctx_.get(),
                     SSL_VERIFY_PEER | SSL_VERIFY_FAIL_IF_NO_PEER_CERT,
                     nullptr);
  SSL_CTX_set_cert_verify_callback(client_ctx_.get(), VerifySucceed, NULL);
  SSL_CTX_set_cert_verify_callback(server_ctx_.get(), VerifySucceed, NULL);

  // By default, the client and server should each only send the leaf.
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(
      ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get()}));
  EXPECT_TRUE(
      ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get()}));

  // If auto-chaining is enabled, then the intermediate is sent.
  SSL_CTX_clear_mode(client_ctx_.get(), SSL_MODE_NO_AUTO_CHAIN);
  SSL_CTX_clear_mode(server_ctx_.get(), SSL_MODE_NO_AUTO_CHAIN);
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()),
                          {cert_.get(), intermediate.get()}));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()),
                          {cert_.get(), intermediate.get()}));

  // Auto-chaining does not override explicitly-configured intermediates.
  ASSERT_TRUE(SSL_CTX_add1_chain_cert(client_ctx_.get(), cert_.get()));
  ASSERT_TRUE(SSL_CTX_add1_chain_cert(server_ctx_.get(), cert_.get()));
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()),
                          {cert_.get(), cert_.get()}));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()),
                          {cert_.get(), cert_.get()}));

  // Auto-chaining does not override explicitly-configured intermediates that
  // are configured as late as cert_cb. If this fails, something in the
  // handshake is likely auto-chaining too early.
  SSL_CTX_clear_chain_certs(client_ctx_.get());
  SSL_CTX_clear_chain_certs(server_ctx_.get());
  auto install_intermediate = [](SSL *ssl, void *arg) -> int {
    return SSL_add1_chain_cert(ssl, static_cast<X509 *>(arg));
  };
  SSL_CTX_set_cert_cb(client_ctx_.get(), install_intermediate, cert_.get());
  SSL_CTX_set_cert_cb(server_ctx_.get(), install_intermediate, cert_.get());
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()),
                          {cert_.get(), cert_.get()}));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()),
                          {cert_.get(), cert_.get()}));
}